

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

void __thiscall
QRegularExpression::QRegularExpression
          (QRegularExpression *this,QString *pattern,PatternOptions options)

{
  long lVar1;
  QRegularExpressionPrivate *pQVar2;
  Int in_EDX;
  QString *in_RSI;
  QRegularExpressionPrivate *in_RDI;
  long in_FS_OFFSET;
  QRegularExpressionPrivate *in_stack_ffffffffffffffa8;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  operator_new(0x48);
  QRegularExpressionPrivate::QRegularExpressionPrivate(in_RDI);
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::QExplicitlySharedDataPointer
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
            ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72d612);
  QString::operator=(in_RSI,(QString *)in_stack_ffffffffffffffa8);
  pQVar2 = QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72d62d);
  (pQVar2->patternOptions).super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
  super_QFlagsStorage<QRegularExpression::PatternOption>.i = in_EDX;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpression::QRegularExpression(const QString &pattern, PatternOptions options)
    : d(new QRegularExpressionPrivate)
{
    d->pattern = pattern;
    d->patternOptions = options;
}